

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdAddTargetAmountForFundRawTx
              (void *handle,void *fund_handle,uint32_t asset_index,int64_t amount,char *asset,
              char *reserved_address)

{
  long *plVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  CfdException *this;
  ulong uVar5;
  string *psVar6;
  CfdCapiFundTargetAmount object;
  allocator local_a9;
  void *local_a8;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  int64_t local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  char *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_a8 = handle;
  local_58 = asset;
  cfd::Initialize();
  local_a0._0_8_ = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"FundRawTxData","");
  cfd::capi::CheckBuffer(fund_handle,(string *)local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._0_8_ != &local_90) {
    operator_delete((void *)local_a0._0_8_);
  }
  plVar1 = *(long **)((long)fund_handle + 0x58);
  if ((plVar1 != (long *)0x0) &&
     (uVar5 = (ulong)asset_index, uVar4 = (plVar1[1] - *plVar1 >> 3) * -0x71c71c71c71c71c7,
     uVar5 <= uVar4 && uVar4 - uVar5 != 0)) {
    local_a0._0_8_ = &local_90;
    local_a0._8_8_ = 0;
    local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffffffffff00;
    local_70 = 0;
    local_68[0] = 0;
    local_80 = amount;
    local_78 = local_68;
    strlen(reserved_address);
    std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,(ulong)reserved_address);
    pcVar2 = local_58;
    bVar3 = cfd::capi::IsEmptyString(local_58);
    if (!bVar3) {
      std::__cxx11::string::string((string *)local_50,pcVar2,&local_a9);
      std::__cxx11::string::operator=((string *)local_a0,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    psVar6 = (string *)(uVar5 * 0x48 + **(long **)((long)fund_handle + 0x58));
    std::__cxx11::string::_M_assign(psVar6);
    *(int64_t *)(psVar6 + 0x20) = local_80;
    std::__cxx11::string::_M_assign(psVar6 + 0x28);
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._0_8_ != &local_90) {
      operator_delete((void *)local_a0._0_8_);
    }
    return 0;
  }
  local_a0._0_8_ = "cfdcapi_transaction.cpp";
  local_a0._8_4_ = 0xc4c;
  local_90._M_allocated_capacity = 0x5f69e9;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,"target amounts is maximum over.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_a0._0_8_ = &local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"Failed to parameter. target amounts is maximum over.","");
  cfd::core::CfdException::CfdException(this,kCfdOutOfRangeError,(string *)local_a0);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTargetAmountForFundRawTx(
    void* handle, void* fund_handle, uint32_t asset_index, int64_t amount,
    const char* asset, const char* reserved_address) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    /*
    if (IsEmptyString(reserved_address)) {
      warn(CFD_LOG_SOURCE, "reserved_address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. reserved_address is null.");
    }
    */

    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);
    if ((buffer->targets == nullptr) ||
        (asset_index >= buffer->targets->size())) {
      warn(CFD_LOG_SOURCE, "target amounts is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. target amounts is maximum over.");
    }

    CfdCapiFundTargetAmount object;
    object.amount = amount;
    object.reserved_address = reserved_address;
    if (!IsEmptyString(asset)) {
#ifndef CFD_DISABLE_ELEMENTS
      object.asset = std::string(asset);
#endif  // CFD_DISABLE_ELEMENTS
    }

    (*buffer->targets)[asset_index] = object;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}